

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGValidStatePtr xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  xmlAttrPtr pxVar1;
  xmlRelaxNGStatesPtr pxVar2;
  _xmlAttr *p_Var3;
  _xmlAttr **pp_Var4;
  xmlNodePtr pxVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlDocPtr pxVar7;
  xmlAttrPtr *__dest;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  xmlAttrPtr attrs [20];
  
  if (node == (xmlNodePtr)0x0) {
    pxVar5 = xmlDocGetRootElement(ctxt->doc);
    uVar11 = 0;
    if (pxVar5 == (xmlNodePtr)0x0) {
      return (xmlRelaxNGValidStatePtr)0x0;
    }
  }
  else {
    uVar11 = 0;
    pp_Var4 = &node->properties;
    while (pxVar1 = *pp_Var4, pxVar1 != (xmlAttrPtr)0x0) {
      if (uVar11 < 0x14) {
        attrs[uVar11] = pxVar1;
      }
      uVar11 = uVar11 + 1;
      pp_Var4 = &pxVar1->next;
    }
    pxVar5 = (xmlNodePtr)0x0;
  }
  uVar10 = (uint)uVar11;
  pxVar2 = ctxt->freeState;
  if ((pxVar2 == (xmlRelaxNGStatesPtr)0x0) || (pxVar2->nbState < 1)) {
    pxVar6 = (xmlRelaxNGValidStatePtr)(*xmlMalloc)(0x38);
    if (pxVar6 == (xmlRelaxNGValidStatePtr)0x0) {
      xmlRngVErrMemory(ctxt);
      return (xmlRelaxNGValidStatePtr)0x0;
    }
    pxVar6->value = (xmlChar *)0x0;
    pxVar6->endvalue = (xmlChar *)0x0;
    pxVar6->nbAttrs = 0;
    pxVar6->maxAttrs = 0;
    *(undefined8 *)&pxVar6->nbAttrLeft = 0;
    pxVar6->node = (xmlNodePtr)0x0;
    pxVar6->seq = (xmlNodePtr)0x0;
    pxVar6->attrs = (xmlAttrPtr *)0x0;
  }
  else {
    uVar9 = pxVar2->nbState - 1;
    pxVar2->nbState = uVar9;
    pxVar6 = pxVar2->tabState[uVar9];
  }
  pxVar6->value = (xmlChar *)0x0;
  pxVar6->endvalue = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    pxVar7 = ctxt->doc;
  }
  else {
    pxVar5 = node->children;
    pxVar7 = (xmlDocPtr)node;
  }
  pxVar6->node = (xmlNodePtr)pxVar7;
  pxVar6->seq = pxVar5;
  pxVar6->nbAttrs = 0;
  if (uVar10 == 0) {
    uVar10 = 0;
  }
  else {
    __dest = pxVar6->attrs;
    if (__dest == (xmlAttrPtr *)0x0) {
      uVar9 = 4;
      if (4 < uVar10) {
        uVar9 = uVar10;
      }
      pxVar6->maxAttrs = uVar9;
      __dest = (xmlAttrPtr *)(*xmlMalloc)((long)(int)uVar9 << 3);
      pxVar6->attrs = __dest;
      if (__dest == (xmlAttrPtr *)0x0) {
LAB_00179b36:
        xmlRngVErrMemory(ctxt);
        return pxVar6;
      }
    }
    else if (pxVar6->maxAttrs < (int)uVar10) {
      __dest = (xmlAttrPtr *)(*xmlRealloc)(__dest,(uVar11 & 0xffffffff) << 3);
      if (__dest == (xmlAttrPtr *)0x0) goto LAB_00179b36;
      pxVar6->attrs = __dest;
      pxVar6->maxAttrs = uVar10;
    }
    pxVar6->nbAttrs = uVar10;
    if (uVar10 < 0x14) {
      memcpy(__dest,attrs,(ulong)(uVar10 << 3));
      uVar10 = pxVar6->nbAttrs;
    }
    else {
      lVar8 = 0;
      pp_Var4 = &node->properties;
      while (p_Var3 = *pp_Var4, p_Var3 != (_xmlAttr *)0x0) {
        *(_xmlAttr **)((long)pxVar6->attrs + lVar8) = p_Var3;
        lVar8 = lVar8 + 8;
        pp_Var4 = &p_Var3->next;
      }
    }
  }
  pxVar6->nbAttrLeft = uVar10;
  return pxVar6;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGNewValidState(xmlRelaxNGValidCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGValidStatePtr ret;
    xmlAttrPtr attr;
    xmlAttrPtr attrs[MAX_ATTR];
    int nbAttrs = 0;
    xmlNodePtr root = NULL;

    if (node == NULL) {
        root = xmlDocGetRootElement(ctxt->doc);
        if (root == NULL)
            return (NULL);
    } else {
        attr = node->properties;
        while (attr != NULL) {
            if (nbAttrs < MAX_ATTR)
                attrs[nbAttrs++] = attr;
            else
                nbAttrs++;
            attr = attr->next;
        }
    }
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    ret->value = NULL;
    ret->endvalue = NULL;
    if (node == NULL) {
        ret->node = (xmlNodePtr) ctxt->doc;
        ret->seq = root;
    } else {
        ret->node = node;
        ret->seq = node->children;
    }
    ret->nbAttrs = 0;
    if (nbAttrs > 0) {
        if (ret->attrs == NULL) {
            if (nbAttrs < 4)
                ret->maxAttrs = 4;
            else
                ret->maxAttrs = nbAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
        } else if (ret->maxAttrs < nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, nbAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                return (ret);
            }
            ret->attrs = tmp;
            ret->maxAttrs = nbAttrs;
        }
        ret->nbAttrs = nbAttrs;
        if (nbAttrs < MAX_ATTR) {
            memcpy(ret->attrs, attrs, sizeof(xmlAttrPtr) * nbAttrs);
        } else {
            attr = node->properties;
            nbAttrs = 0;
            while (attr != NULL) {
                ret->attrs[nbAttrs++] = attr;
                attr = attr->next;
            }
        }
    }
    ret->nbAttrLeft = ret->nbAttrs;
    return (ret);
}